

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

void Dau_DsdTruth6Compose_rec(word Func,word (*pFanins) [64],word *pRes,int nVars,int nWordsR)

{
  int iVar1;
  word wVar2;
  word local_428;
  word pTtTemp [2] [64];
  int nWordsR_local;
  int nVars_local;
  word *pRes_local;
  word (*pFanins_local) [64];
  word Func_local;
  
  pTtTemp[1][0x3f]._0_4_ = nWordsR;
  pTtTemp[1][0x3f]._4_4_ = nVars;
  if (Func == 0) {
    Abc_TtConst0(pRes,nWordsR);
  }
  else if (Func == 0xffffffffffffffff) {
    Abc_TtConst1(pRes,nWordsR);
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x1e1,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)");
    }
    pTtTemp[1][0x3f]._4_4_ = nVars + -1;
    if (pTtTemp[1][0x3f]._4_4_ == 0) {
      if ((Func != s_Truths6[0]) && (Func != s_Truths6Neg[0])) {
        __assert_fail("Func == s_Truths6[0] || Func == s_Truths6Neg[0]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x1e4,"void Dau_DsdTruth6Compose_rec(word, word (*)[64], word *, int, int)");
      }
      Abc_TtCopy(pRes,*pFanins,nWordsR,(uint)(Func == s_Truths6Neg[0]));
    }
    else {
      iVar1 = Abc_Tt6HasVar(Func,pTtTemp[1][0x3f]._4_4_);
      if (iVar1 == 0) {
        Dau_DsdTruth6Compose_rec(Func,pFanins,pRes,pTtTemp[1][0x3f]._4_4_,(int)pTtTemp[1][0x3f]);
      }
      else {
        wVar2 = Abc_Tt6Cofactor0(Func,pTtTemp[1][0x3f]._4_4_);
        Dau_DsdTruth6Compose_rec
                  (wVar2,pFanins,&local_428,pTtTemp[1][0x3f]._4_4_,(int)pTtTemp[1][0x3f]);
        wVar2 = Abc_Tt6Cofactor1(Func,pTtTemp[1][0x3f]._4_4_);
        Dau_DsdTruth6Compose_rec
                  (wVar2,pFanins,pTtTemp[0] + 0x3f,pTtTemp[1][0x3f]._4_4_,(int)pTtTemp[1][0x3f]);
        Abc_TtMux(pRes,pFanins[pTtTemp[1][0x3f]._4_4_],pTtTemp[0] + 0x3f,&local_428,
                  (int)pTtTemp[1][0x3f]);
      }
    }
  }
  return;
}

Assistant:

void Dau_DsdTruth6Compose_rec( word Func, word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], word * pRes, int nVars, int nWordsR )
{
    if ( Func == 0 )
    {
        Abc_TtConst0( pRes, nWordsR );
        return;
    }
    if ( Func == ~(word)0 )
    {
        Abc_TtConst1( pRes, nWordsR );
        return;
    }
    assert( nVars > 0 );
    if ( --nVars == 0 )
    {
        assert( Func == s_Truths6[0] || Func == s_Truths6Neg[0] );
        Abc_TtCopy( pRes, pFanins[0], nWordsR, Func == s_Truths6Neg[0] );
        return;
    }
    if ( !Abc_Tt6HasVar(Func, nVars) )
    {
        Dau_DsdTruth6Compose_rec( Func, pFanins, pRes, nVars, nWordsR );
        return;
    }
    {
        word pTtTemp[2][DAU_MAX_WORD];
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor0(Func, nVars), pFanins, pTtTemp[0], nVars, nWordsR );
        Dau_DsdTruth6Compose_rec( Abc_Tt6Cofactor1(Func, nVars), pFanins, pTtTemp[1], nVars, nWordsR );
        Abc_TtMux( pRes, pFanins[nVars], pTtTemp[1], pTtTemp[0], nWordsR );
        return;
    }
}